

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O3

int __thiscall
IServer::SendPackMsg<CNetMsg_Sv_WeaponPickup>
          (IServer *this,CNetMsg_Sv_WeaponPickup *pMsg,int Flags,int ClientID)

{
  int iVar1;
  long in_FS_OFFSET;
  CMsgPacker Packer;
  CPacker CStack_848;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CPacker::Reset(&CStack_848);
  CPacker::AddInt(&CStack_848,0x12);
  CPacker::AddInt(&CStack_848,pMsg->m_Weapon);
  iVar1 = -1;
  if (CStack_848.m_Error == 0) {
    iVar1 = (*(this->super_IInterface)._vptr_IInterface[9])
                      (this,&CStack_848,(ulong)(uint)Flags,(ulong)(uint)ClientID);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int SendPackMsg(T *pMsg, int Flags, int ClientID)
	{
		CMsgPacker Packer(pMsg->MsgID(), false);
		if(pMsg->Pack(&Packer))
			return -1;
		return SendMsg(&Packer, Flags, ClientID);
	}